

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

void gameboy_sound_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte bVar1;
  
  bVar1 = (byte)MuteMask;
  *(byte *)((long)chip + 0x3e) = bVar1 & 1;
  *(byte *)((long)chip + 0x72) = bVar1 >> 1 & 1;
  *(byte *)((long)chip + 0xa6) = bVar1 >> 2 & 1;
  *(byte *)((long)chip + 0xda) = bVar1 >> 3 & 1;
  return;
}

Assistant:

static void gameboy_sound_set_mute_mask(void *chip, UINT32 MuteMask)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	
	gb->snd_1.Muted = (MuteMask >> 0) & 0x01;
	gb->snd_2.Muted = (MuteMask >> 1) & 0x01;
	gb->snd_3.Muted = (MuteMask >> 2) & 0x01;
	gb->snd_4.Muted = (MuteMask >> 3) & 0x01;
	
	return;
}